

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityCapabilities.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::EntityCapabilities::EntityCapabilities
          (EntityCapabilities *this,KBOOL AmunitionSupply,KBOOL FuelSupply,KBOOL RecoveryService,
          KBOOL RepairService,KBOOL ADSB)

{
  undefined3 in_register_00000009;
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EntityCapabilities_00225ba8;
  (this->field_0).m_ui16Data =
       CONCAT31(in_register_00000089,ADSB) << 4 |
       CONCAT31(in_register_00000031,AmunitionSupply) +
       CONCAT31(in_register_00000011,FuelSupply) * 2 +
       CONCAT31(in_register_00000009,RecoveryService) * 4 +
       CONCAT31(in_register_00000081,RepairService) * 8;
  return;
}

Assistant:

EntityCapabilities::EntityCapabilities( KBOOL AmunitionSupply, KBOOL FuelSupply, KBOOL RecoveryService, KBOOL RepairService, KBOOL ADSB )
{
    m_Unused = 0;
    m_AmmunitionSupply = AmunitionSupply;
    m_FuelSupply = FuelSupply;
    m_RecoveryService = RecoveryService;
    m_RepairService = RepairService;
	m_ADSB = ADSB;
}